

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IpAddress.cpp
# Opt level: O0

void __thiscall mognetwork::IpAddress::resolve(IpAddress *this)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  addrinfo *result;
  addrinfo hints;
  uint32_t ip;
  char *in_stack_ffffffffffffffa8;
  addrinfo *local_48;
  addrinfo local_40;
  in_addr_t local_c;
  
  bVar1 = std::operator==(in_RDI,in_stack_ffffffffffffffa8);
  if (bVar1) {
    *(undefined4 *)(in_RDI + 0x28) = 0xffffffff;
  }
  else {
    pcVar3 = (char *)std::__cxx11::string::c_str();
    local_c = inet_addr(pcVar3);
    if (local_c == 0xffffffff) {
      memset(&local_40,0,0x30);
      local_40.ai_family = 2;
      local_48 = (addrinfo *)0x0;
      pcVar3 = (char *)std::__cxx11::string::c_str();
      iVar2 = getaddrinfo(pcVar3,(char *)0x0,&local_40,&local_48);
      if ((iVar2 == 0) && (local_48 != (addrinfo *)0x0)) {
        local_c = *(in_addr_t *)(local_48->ai_addr->sa_data + 2);
        freeaddrinfo(local_48);
        *(in_addr_t *)(in_RDI + 0x28) = local_c;
      }
    }
    else {
      *(in_addr_t *)(in_RDI + 0x28) = local_c;
    }
  }
  return;
}

Assistant:

void IpAddress::resolve()
  {
    if (m_sAddress == "255.255.255.255")
      m_address = INADDR_BROADCAST;
    else
      {
	uint32_t ip = inet_addr(m_sAddress.c_str());
	if (ip != INADDR_NONE)
	  m_address = ip;
	else
	  {
	    addrinfo hints;
	    memset(&hints, 0, sizeof(hints));
	    hints.ai_family = AF_INET;
	    addrinfo* result = NULL;
	    if (getaddrinfo(m_sAddress.c_str(), NULL, &hints, &result) == 0)
	      {
		if (result)
		  {
		    ip = reinterpret_cast<sockaddr_in*>(result->ai_addr)->sin_addr.s_addr;
		    freeaddrinfo(result);
		    m_address = ip;
		  }
	      }
	  }
      }
  }